

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::
     PrintTupleTo<std::tuple<ot::commissioner::ActiveOperationalDataset&,unsigned_short>,2ul>
               (long t,ostream *param_2)

{
  UniversalPrinter<ot::commissioner::ActiveOperationalDataset_&>::Print
            (*(ActiveOperationalDataset **)(t + 8),param_2);
  std::__ostream_insert<char,std::char_traits<char>>(param_2,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}